

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O0

undefined8 __thiscall
cnn::KMaxPooling::as_string
          (KMaxPooling *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arg_names)

{
  ostream *poVar1;
  const_reference pvVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  ostringstream os;
  ostringstream local_190 [376];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  local_18 = in_RDX;
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"kmaxpool(");
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](local_18,0);
  poVar1 = std::operator<<(poVar1,(string *)pvVar2);
  poVar1 = std::operator<<(poVar1,", k=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RSI + 0x50));
  std::operator<<(poVar1,')');
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

string KMaxPooling::as_string(const vector<string>& arg_names) const {
  ostringstream os;
  os << "kmaxpool(" << arg_names[0] << ", k=" << k << ')';
  return os.str();
}